

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenMap.cpp
# Opt level: O0

void __thiscall OpenMD::TokenMap::TokenMap(TokenMap *this)

{
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>
  this_00;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>
  __y;
  undefined1 uVar1;
  value_type *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>,_bool>
  pVar2;
  undefined4 in_stack_ffffffffffffe5f8;
  int in_stack_ffffffffffffe5fc;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  *in_stack_ffffffffffffe600;
  value_type *in_stack_ffffffffffffe608;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
  *in_stack_ffffffffffffe610;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
  *this_01;
  Token *in_stack_ffffffffffffe620;
  char (*in_stack_ffffffffffffe628) [10];
  value_type *__x;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  *in_stack_ffffffffffffe630;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  *this_02;
  undefined7 in_stack_ffffffffffffe638;
  undefined1 in_stack_ffffffffffffe63f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe640;
  undefined1 local_1561 [129];
  _Base_ptr local_14e0;
  undefined1 local_14d8;
  undefined1 local_14c9 [129];
  _Base_ptr local_1448;
  undefined1 local_1440;
  allocator<char> local_1431;
  string local_1430 [128];
  _Base_ptr local_13b0;
  undefined1 local_13a8;
  allocator<char> local_1399;
  string local_1398 [128];
  _Base_ptr local_1318;
  undefined1 local_1310;
  allocator<char> local_1301;
  string local_1300 [128];
  _Base_ptr local_1280;
  undefined1 local_1278;
  allocator<char> local_1269;
  string local_1268 [128];
  _Base_ptr local_11e8;
  undefined1 local_11e0;
  allocator<char> local_11d1;
  string local_11d0 [128];
  _Base_ptr local_1150;
  undefined1 local_1148;
  allocator<char> local_1139;
  string local_1138 [128];
  _Base_ptr local_10b8;
  undefined1 local_10b0;
  allocator<char> local_10a1;
  string local_10a0 [128];
  _Base_ptr local_1020;
  undefined1 local_1018;
  allocator<char> local_1009;
  string local_1008 [128];
  _Base_ptr local_f88;
  undefined1 local_f80;
  allocator<char> local_f71;
  string local_f70 [128];
  _Base_ptr local_ef0;
  undefined1 local_ee8;
  allocator<char> local_ed9;
  string local_ed8 [128];
  _Base_ptr local_e58;
  undefined1 local_e50;
  allocator<char> local_e41;
  string local_e40 [128];
  _Base_ptr local_dc0;
  undefined1 local_db8;
  allocator<char> local_da9;
  string local_da8 [128];
  _Base_ptr local_d28;
  undefined1 local_d20;
  allocator<char> local_d11;
  string local_d10 [128];
  _Base_ptr local_c90;
  undefined1 local_c88;
  allocator<char> local_c79;
  string local_c78 [128];
  _Base_ptr local_bf8;
  undefined1 local_bf0;
  allocator<char> local_be1;
  string local_be0 [128];
  _Base_ptr local_b60;
  undefined1 local_b58;
  allocator<char> local_b49;
  string local_b48 [128];
  _Base_ptr local_ac8;
  undefined1 local_ac0;
  allocator<char> local_ab1;
  string local_ab0 [128];
  _Base_ptr local_a30;
  undefined1 local_a28;
  allocator<char> local_a19;
  string local_a18 [128];
  _Base_ptr local_998;
  undefined1 local_990;
  allocator<char> local_981;
  string local_980 [128];
  _Base_ptr local_900;
  undefined1 local_8f8;
  allocator<char> local_8e9;
  string local_8e8 [128];
  _Base_ptr local_868;
  undefined1 local_860;
  allocator<char> local_851;
  string local_850 [128];
  _Base_ptr local_7d0;
  undefined1 local_7c8;
  allocator<char> local_7b9;
  string local_7b8 [128];
  _Base_ptr local_738;
  undefined1 local_730;
  allocator<char> local_721;
  string local_720 [128];
  _Base_ptr local_6a0;
  undefined1 local_698;
  allocator<char> local_689;
  string local_688 [128];
  _Base_ptr local_608;
  undefined1 local_600;
  allocator<char> local_5f1;
  string local_5f0 [128];
  _Base_ptr local_570;
  undefined1 local_568;
  allocator<char> local_559;
  string local_558 [128];
  _Base_ptr local_4d8;
  undefined1 local_4d0;
  allocator<char> local_4c1;
  string local_4c0 [128];
  _Base_ptr local_440;
  undefined1 local_438;
  allocator<char> local_429;
  string local_428 [128];
  _Base_ptr local_3a8;
  undefined1 local_3a0;
  allocator<char> local_391;
  string local_390 [128];
  _Base_ptr local_310;
  undefined1 local_308;
  allocator<char> local_2f9;
  string local_2f8 [128];
  _Base_ptr local_278;
  undefined1 local_270;
  allocator<char> local_261;
  string local_260 [128];
  _Base_ptr local_1e0;
  undefined1 local_1d8;
  allocator<char> local_1c9;
  string local_1c8 [128];
  _Base_ptr local_148;
  undefined1 local_140;
  allocator<char> local_131;
  string local_130 [128];
  _Base_ptr local_b0;
  undefined1 local_a8;
  allocator<char> local_89;
  string local_88 [136];
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
         *)0x3fb84a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fb8ae);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[7],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [7])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_b0 = (_Base_ptr)pVar2.first._M_node;
  local_a8 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fb92c);
  std::any::~any((any *)0x3fb939);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fb9c7);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[7],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [7])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_148 = (_Base_ptr)pVar2.first._M_node;
  local_140 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fba45);
  std::any::~any((any *)0x3fba52);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fbae0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [2])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_1e0 = (_Base_ptr)pVar2.first._M_node;
  local_1d8 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fbb5e);
  std::any::~any((any *)0x3fbb6b);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fbbf9);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [2])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_278 = (_Base_ptr)pVar2.first._M_node;
  local_270 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fbc77);
  std::any::~any((any *)0x3fbc84);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator(&local_261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fbd12);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[4],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [4])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_310 = (_Base_ptr)pVar2.first._M_node;
  local_308 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fbd90);
  std::any::~any((any *)0x3fbd9d);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fbe2b);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [2])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_3a8 = (_Base_ptr)pVar2.first._M_node;
  local_3a0 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fbea9);
  std::any::~any((any *)0x3fbeb6);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator(&local_391);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fbf44);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[3],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [3])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_440 = (_Base_ptr)pVar2.first._M_node;
  local_438 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fbfc2);
  std::any::~any((any *)0x3fbfcf);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator(&local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fc05d);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[3],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [3])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_4d8 = (_Base_ptr)pVar2.first._M_node;
  local_4d0 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fc0db);
  std::any::~any((any *)0x3fc0e8);
  std::__cxx11::string::~string(local_4c0);
  std::allocator<char>::~allocator(&local_4c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fc176);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [2])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_570 = (_Base_ptr)pVar2.first._M_node;
  local_568 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fc1f4);
  std::any::~any((any *)0x3fc201);
  std::__cxx11::string::~string(local_558);
  std::allocator<char>::~allocator(&local_559);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fc28f);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [2])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_608 = (_Base_ptr)pVar2.first._M_node;
  local_600 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fc30d);
  std::any::~any((any *)0x3fc31a);
  std::__cxx11::string::~string(local_5f0);
  std::allocator<char>::~allocator(&local_5f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fc3a8);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[3],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [3])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_6a0 = (_Base_ptr)pVar2.first._M_node;
  local_698 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fc426);
  std::any::~any((any *)0x3fc433);
  std::__cxx11::string::~string(local_688);
  std::allocator<char>::~allocator(&local_689);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fc4c1);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[4],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [4])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_738 = (_Base_ptr)pVar2.first._M_node;
  local_730 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fc53f);
  std::any::~any((any *)0x3fc54c);
  std::__cxx11::string::~string(local_720);
  std::allocator<char>::~allocator(&local_721);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fc5da);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [2])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_7d0 = (_Base_ptr)pVar2.first._M_node;
  local_7c8 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fc658);
  std::any::~any((any *)0x3fc665);
  std::__cxx11::string::~string(local_7b8);
  std::allocator<char>::~allocator(&local_7b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fc6f3);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [2])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_868 = (_Base_ptr)pVar2.first._M_node;
  local_860 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fc771);
  std::any::~any((any *)0x3fc77e);
  std::__cxx11::string::~string(local_850);
  std::allocator<char>::~allocator(&local_851);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fc80c);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[3],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [3])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_900 = (_Base_ptr)pVar2.first._M_node;
  local_8f8 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fc88a);
  std::any::~any((any *)0x3fc897);
  std::__cxx11::string::~string(local_8e8);
  std::allocator<char>::~allocator(&local_8e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fc925);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[3],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [3])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_998 = (_Base_ptr)pVar2.first._M_node;
  local_990 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fc9a3);
  std::any::~any((any *)0x3fc9b0);
  std::__cxx11::string::~string(local_980);
  std::allocator<char>::~allocator(&local_981);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fca3e);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [2])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_a30 = (_Base_ptr)pVar2.first._M_node;
  local_a28 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fcabc);
  std::any::~any((any *)0x3fcac9);
  std::__cxx11::string::~string(local_a18);
  std::allocator<char>::~allocator(&local_a19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fcb57);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[3],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [3])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_ac8 = (_Base_ptr)pVar2.first._M_node;
  local_ac0 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fcbd5);
  std::any::~any((any *)0x3fcbe2);
  std::__cxx11::string::~string(local_ab0);
  std::allocator<char>::~allocator(&local_ab1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fcc70);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[3],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [3])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_b60 = (_Base_ptr)pVar2.first._M_node;
  local_b58 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fccee);
  std::any::~any((any *)0x3fccfb);
  std::__cxx11::string::~string(local_b48);
  std::allocator<char>::~allocator(&local_b49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fcd89);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[7],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [7])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_bf8 = (_Base_ptr)pVar2.first._M_node;
  local_bf0 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fce07);
  std::any::~any((any *)0x3fce14);
  std::__cxx11::string::~string(local_be0);
  std::allocator<char>::~allocator(&local_be1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fcea2);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [2])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_c90 = (_Base_ptr)pVar2.first._M_node;
  local_c88 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fcf20);
  std::any::~any((any *)0x3fcf2d);
  std::__cxx11::string::~string(local_c78);
  std::allocator<char>::~allocator(&local_c79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fcfbb);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[5],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [5])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_d28 = (_Base_ptr)pVar2.first._M_node;
  local_d20 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fd039);
  std::any::~any((any *)0x3fd046);
  std::__cxx11::string::~string(local_d10);
  std::allocator<char>::~allocator(&local_d11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fd0d4);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[7],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [7])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_dc0 = (_Base_ptr)pVar2.first._M_node;
  local_db8 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fd152);
  std::any::~any((any *)0x3fd15f);
  std::__cxx11::string::~string(local_da8);
  std::allocator<char>::~allocator(&local_da9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fd1ed);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[5],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [5])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_e58 = (_Base_ptr)pVar2.first._M_node;
  local_e50 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fd26b);
  std::any::~any((any *)0x3fd278);
  std::__cxx11::string::~string(local_e40);
  std::allocator<char>::~allocator(&local_e41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fd306);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[10],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,in_stack_ffffffffffffe628,in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_ef0 = (_Base_ptr)pVar2.first._M_node;
  local_ee8 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fd384);
  std::any::~any((any *)0x3fd391);
  std::__cxx11::string::~string(local_ed8);
  std::allocator<char>::~allocator(&local_ed9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fd41f);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [2])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_f88 = (_Base_ptr)pVar2.first._M_node;
  local_f80 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fd49d);
  std::any::~any((any *)0x3fd4aa);
  std::__cxx11::string::~string(local_f70);
  std::allocator<char>::~allocator(&local_f71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fd538);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [2])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_1020 = (_Base_ptr)pVar2.first._M_node;
  local_1018 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fd5b6);
  std::any::~any((any *)0x3fd5c3);
  std::__cxx11::string::~string(local_1008);
  std::allocator<char>::~allocator(&local_1009);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fd651);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [2])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_10b8 = (_Base_ptr)pVar2.first._M_node;
  local_10b0 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fd6cf);
  std::any::~any((any *)0x3fd6dc);
  std::__cxx11::string::~string(local_10a0);
  std::allocator<char>::~allocator(&local_10a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fd76a);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[9],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [9])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_1150 = (_Base_ptr)pVar2.first._M_node;
  local_1148 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fd7e8);
  std::any::~any((any *)0x3fd7f5);
  std::__cxx11::string::~string(local_1138);
  std::allocator<char>::~allocator(&local_1139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fd883);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[9],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [9])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_11e8 = (_Base_ptr)pVar2.first._M_node;
  local_11e0 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fd901);
  std::any::~any((any *)0x3fd90e);
  std::__cxx11::string::~string(local_11d0);
  std::allocator<char>::~allocator(&local_11d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fd99c);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[9],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [9])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_1280 = (_Base_ptr)pVar2.first._M_node;
  local_1278 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fda1a);
  std::any::~any((any *)0x3fda27);
  std::__cxx11::string::~string(local_1268);
  std::allocator<char>::~allocator(&local_1269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fdab5);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[7],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [7])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_1318 = (_Base_ptr)pVar2.first._M_node;
  local_1310 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fdb33);
  std::any::~any((any *)0x3fdb40);
  std::__cxx11::string::~string(local_1300);
  std::allocator<char>::~allocator(&local_1301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fdbc5);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [2])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  local_13b0 = (_Base_ptr)pVar2.first._M_node;
  local_13a8 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fdc34);
  std::any::~any((any *)0x3fdc41);
  std::__cxx11::string::~string(local_1398);
  std::allocator<char>::~allocator(&local_1399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe640,
             (char *)CONCAT17(in_stack_ffffffffffffe63f,in_stack_ffffffffffffe638),
             (allocator<char> *)in_stack_ffffffffffffe630);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fdcc6);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[3],_OpenMD::Token,_true>
            (in_stack_ffffffffffffe630,(char (*) [3])in_stack_ffffffffffffe628,
             in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  this_00 = pVar2.first._M_node;
  uVar1 = pVar2.second;
  local_1448 = this_00._M_node;
  local_1440 = uVar1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fdd35);
  std::any::~any((any *)0x3fdd42);
  std::__cxx11::string::~string(local_1430);
  std::allocator<char>::~allocator(&local_1431);
  this_02 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
             *)local_14c9;
  __x = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00._M_node,
             (char *)CONCAT17(uVar1,in_stack_ffffffffffffe638),(allocator<char> *)this_02);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fddc7);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[4],_OpenMD::Token,_true>
            (this_02,(char (*) [4])__x,in_stack_ffffffffffffe620);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(in_stack_ffffffffffffe610,in_stack_ffffffffffffe608);
  __y = pVar2.first._M_node;
  local_14d8 = pVar2.second;
  local_14e0 = __y._M_node;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair(in_stack_ffffffffffffe600);
  Token::~Token((Token *)0x3fde36);
  std::any::~any((any *)0x3fde43);
  std::__cxx11::string::~string((string *)(local_14c9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_14c9);
  this_01 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
             *)local_1561;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00._M_node,
             (char *)CONCAT17(uVar1,in_stack_ffffffffffffe638),(allocator<char> *)this_02);
  std::any::
  any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
            ((any *)in_stack_ffffffffffffe600,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
  Token::Token((Token *)in_stack_ffffffffffffe600,in_stack_ffffffffffffe5fc,(any *)0x3fdec8);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[5],_OpenMD::Token,_true>(this_02,(char (*) [5])__x,(Token *)__y._M_node);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>_>_>
          ::insert(this_01,in_RDI);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
           *)pVar2.first._M_node._M_node);
  Token::~Token((Token *)0x3fdf37);
  std::any::~any((any *)0x3fdf44);
  std::__cxx11::string::~string((string *)(local_1561 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1561);
  return;
}

Assistant:

TokenMap::TokenMap() {
    tokenMap_.insert(TokenMapType::value_type(
        "define", Token(Token::define, std::string("define"))));
    tokenMap_.insert(TokenMapType::value_type(
        "select", Token(Token::select, std::string("select"))));
    // tokenMap_.insert(TokenMapType::value_type("selected",
    // Token(Token::selected, std::string("selected"))));

    // expressions
    tokenMap_.insert(TokenMapType::value_type(
        "(", Token(Token::leftparen, std::string("("))));
    tokenMap_.insert(TokenMapType::value_type(
        ")", Token(Token::rightparen, std::string(")"))));

    tokenMap_.insert(TokenMapType::value_type(
        "and", Token(Token::opAnd, std::string("and"))));
    tokenMap_.insert(
        TokenMapType::value_type("&", Token(Token::opAnd, std::string("and"))));
    tokenMap_.insert(TokenMapType::value_type(
        "&&", Token(Token::opAnd, std::string("and"))));

    tokenMap_.insert(
        TokenMapType::value_type("or", Token(Token::opOr, std::string("or"))));
    tokenMap_.insert(
        TokenMapType::value_type(",", Token(Token::opOr, std::string("or"))));
    tokenMap_.insert(
        TokenMapType::value_type("|", Token(Token::opOr, std::string("or"))));
    tokenMap_.insert(
        TokenMapType::value_type("||", Token(Token::opOr, std::string("or"))));

    tokenMap_.insert(TokenMapType::value_type(
        "not", Token(Token::opNot, std::string("not"))));
    tokenMap_.insert(
        TokenMapType::value_type("!", Token(Token::opNot, std::string("not"))));

    tokenMap_.insert(
        TokenMapType::value_type("<", Token(Token::opLT, std::string("<"))));
    tokenMap_.insert(
        TokenMapType::value_type("<=", Token(Token::opLE, std::string("<="))));
    tokenMap_.insert(
        TokenMapType::value_type(">=", Token(Token::opGE, std::string(">="))));
    tokenMap_.insert(
        TokenMapType::value_type(">", Token(Token::opGT, std::string(">"))));
    tokenMap_.insert(
        TokenMapType::value_type("==", Token(Token::opEQ, std::string("=="))));
    tokenMap_.insert(
        TokenMapType::value_type("!=", Token(Token::opNE, std::string("!="))));
    tokenMap_.insert(TokenMapType::value_type(
        "within", Token(Token::within, std::string("within"))));
    tokenMap_.insert(
        TokenMapType::value_type(".", Token(Token::dot, std::string("."))));
    tokenMap_.insert(TokenMapType::value_type(
        "mass", Token(Token::mass, std::string("mass"))));
    tokenMap_.insert(TokenMapType::value_type(
        "charge", Token(Token::charge, std::string("charge"))));
    tokenMap_.insert(TokenMapType::value_type(
        "hull", Token(Token::hull, std::string("hull"))));
    tokenMap_.insert(TokenMapType::value_type(
        "alphahull", Token(Token::alphahull, std::string("alphahull"))));
    tokenMap_.insert(
        TokenMapType::value_type("x", Token(Token::x, std::string("x"))));
    tokenMap_.insert(
        TokenMapType::value_type("y", Token(Token::y, std::string("y"))));
    tokenMap_.insert(
        TokenMapType::value_type("z", Token(Token::z, std::string("z"))));
    tokenMap_.insert(TokenMapType::value_type(
        "wrappedx", Token(Token::wrappedX, std::string("wrappedx"))));
    tokenMap_.insert(TokenMapType::value_type(
        "wrappedy", Token(Token::wrappedY, std::string("wrappedy"))));
    tokenMap_.insert(TokenMapType::value_type(
        "wrappedz", Token(Token::wrappedZ, std::string("wrappedz"))));
    tokenMap_.insert(TokenMapType::value_type(
        "atomno", Token(Token::atomno, std::string("atomno"))));
    tokenMap_.insert(
        TokenMapType::value_type("r", Token(Token::r, std::string("r"))));
    tokenMap_.insert(
        TokenMapType::value_type("to", Token(Token::to, std::string("to"))));

    tokenMap_.insert(
        TokenMapType::value_type("all", Token(Token::all, std::string("all"))));
    tokenMap_.insert(TokenMapType::value_type(
        "none", Token(Token::none, std::string("none"))));
  }